

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O3

void __thiscall jrtplib::RTPSession::Destroy(RTPSession *this)

{
  RTPMemoryManager *pRVar1;
  RTPTransmitter *pRVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  
  if (this->created == true) {
    if (this->deletetransmitter == true) {
      pRVar1 = (this->super_RTPMemoryObject).mgr;
      pRVar2 = this->rtptrans;
      if (pRVar1 == (RTPMemoryManager *)0x0) {
        if (pRVar2 != (RTPTransmitter *)0x0) {
          (*(pRVar2->super_RTPMemoryObject)._vptr_RTPMemoryObject[1])(pRVar2);
        }
      }
      else {
        (**(pRVar2->super_RTPMemoryObject)._vptr_RTPMemoryObject)(pRVar2);
        (**(code **)(*(long *)pRVar1 + 0x18))(pRVar1,pRVar2);
      }
    }
    RTPPacketBuilder::Destroy(&this->packetbuilder);
    RTCPPacketBuilder::Destroy(&this->rtcpbuilder);
    RTCPScheduler::Reset(&this->rtcpsched);
    RTPCollisionList::Clear(&this->collisionlist);
    RTPSources::Clear(&(this->sources).super_RTPSources);
    for (p_Var4 = (this->byepackets).
                  super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        p_Var4 != (_List_node_base *)&this->byepackets; p_Var4 = p_Var4->_M_next) {
      p_Var3 = p_Var4[1]._M_next;
      pRVar1 = (this->super_RTPMemoryObject).mgr;
      if (pRVar1 == (RTPMemoryManager *)0x0) {
        if (p_Var3 != (_List_node_base *)0x0) {
          (**(code **)((long)p_Var3->_M_next + 8))(p_Var3);
        }
      }
      else {
        (**(code **)p_Var3->_M_next)(p_Var3);
        (**(code **)(*(long *)pRVar1 + 0x18))(pRVar1,p_Var3);
      }
    }
    std::__cxx11::
    list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>::clear
              (&this->byepackets);
    this->created = false;
  }
  return;
}

Assistant:

void RTPSession::Destroy()
{
	if (!created)
		return;

#ifdef RTP_SUPPORT_THREAD
	if (pollthread)
		RTPDelete(pollthread,GetMemoryManager());
#endif // RTP_SUPPORT_THREAD
	
	if (deletetransmitter)
		RTPDelete(rtptrans,GetMemoryManager());
	packetbuilder.Destroy();
	rtcpbuilder.Destroy();
	rtcpsched.Reset();
	collisionlist.Clear();
	sources.Clear();

	std::list<RTCPCompoundPacket *>::const_iterator it;

	for (it = byepackets.begin() ; it != byepackets.end() ; it++)
		RTPDelete(*it,GetMemoryManager());
	byepackets.clear();
	
	created = false;
}